

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GLTargetBind(AGLDrawTarget *target)

{
  AGLDrawTarget *target_local;
  
  a__GLFramebufferBind(target->framebuffer);
  if (((((target->viewport).x != a__gl_state.viewport.x) ||
       ((target->viewport).y != a__gl_state.viewport.y)) ||
      ((target->viewport).w != a__gl_state.viewport.w)) ||
     ((target->viewport).h != a__gl_state.viewport.h)) {
    a__gl_state.viewport.x = (target->viewport).x;
    a__gl_state.viewport.y = (target->viewport).y;
    a__gl_state.viewport.w = (target->viewport).w;
    a__gl_state.viewport.h = (target->viewport).h;
    glViewport((target->viewport).x,(target->viewport).y,(target->viewport).w,(target->viewport).h);
  }
  return;
}

Assistant:

static void a__GLTargetBind(const AGLDrawTarget *target) {
	ATTO_GL_PROFILE_PREAMBLE
	a__GLFramebufferBind(target->framebuffer);

	if (target->viewport.x != a__gl_state.viewport.x || target->viewport.y != a__gl_state.viewport.y ||
		target->viewport.w != a__gl_state.viewport.w || target->viewport.h != a__gl_state.viewport.h) {
		a__gl_state.viewport.x = target->viewport.x;
		a__gl_state.viewport.y = target->viewport.y;
		a__gl_state.viewport.w = target->viewport.w;
		a__gl_state.viewport.h = target->viewport.h;

		AGL__CALL(glViewport(target->viewport.x, target->viewport.y, target->viewport.w, target->viewport.h));
	}
	ATTO_GL_PROFILE_FUNC(__FUNCTION__, aAppTime() - start);
}